

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NextColumn(void)

{
  ImGuiWindow *pIVar1;
  ImGuiColumnsSet *pIVar2;
  ImGuiContext *pIVar3;
  int column_index;
  uint uVar4;
  float fVar5;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if ((pIVar1->SkipItems == false) && ((pIVar1->DC).ColumnsSet != (ImGuiColumnsSet *)0x0)) {
    PopItemWidth();
    PopClipRect();
    pIVar2 = (pIVar1->DC).ColumnsSet;
    fVar5 = (pIVar1->DC).CursorPos.y;
    uVar4 = -(uint)(fVar5 <= pIVar2->LineMaxY);
    pIVar2->LineMaxY = (float)(~uVar4 & (uint)fVar5 | (uint)pIVar2->LineMaxY & uVar4);
    column_index = pIVar2->Current + 1;
    pIVar2->Current = column_index;
    if (column_index < pIVar2->Count) {
      fVar5 = GetColumnOffset(column_index);
      (pIVar1->DC).ColumnsOffset.x = (fVar5 - (pIVar1->DC).Indent.x) + (pIVar3->Style).ItemSpacing.x
      ;
      ImDrawList::ChannelsSetCurrent(pIVar1->DrawList,column_index);
      fVar5 = pIVar2->LineMinY;
    }
    else {
      (pIVar1->DC).ColumnsOffset.x = 0.0;
      ImDrawList::ChannelsSetCurrent(pIVar1->DrawList,0);
      pIVar2->Current = 0;
      fVar5 = pIVar2->LineMaxY;
      pIVar2->LineMinY = fVar5;
    }
    (pIVar1->DC).CursorPos.x =
         (float)(int)((pIVar1->Pos).x + (pIVar1->DC).Indent.x + (pIVar1->DC).ColumnsOffset.x);
    (pIVar1->DC).CursorPos.y = fVar5;
    (pIVar1->DC).CurrentLineSize.x = 0.0;
    (pIVar1->DC).CurrentLineSize.y = 0.0;
    (pIVar1->DC).CurrentLineTextBaseOffset = 0.0;
    PushColumnClipRect(-1);
    fVar5 = GetColumnWidth(-1);
    PushItemWidth(fVar5 * 0.65);
    return;
  }
  return;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = toupper(*str2) - toupper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}